

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-server.c
# Opt level: O2

void after_write(uv_write_t *req,int status)

{
  FILE *__stream;
  char *pcVar1;
  char *pcVar2;
  
  free(req[1].data);
  free(req);
  __stream = _stderr;
  if (status == 0) {
    return;
  }
  pcVar1 = uv_err_name(status);
  pcVar2 = uv_strerror(status);
  fprintf(__stream,"uv_write error: %s - %s\n",pcVar1,pcVar2);
  return;
}

Assistant:

static void after_write(uv_write_t* req, int status) {
  write_req_t* wr;

  /* Free the read/write buffer and the request */
  wr = (write_req_t*) req;
  free(wr->buf.base);
  free(wr);

  if (status == 0)
    return;

  fprintf(stderr,
          "uv_write error: %s - %s\n",
          uv_err_name(status),
          uv_strerror(status));
}